

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O1

void rpc_tests::CheckRpc(vector<RPCArg,_std::allocator<RPCArg>_> *params,UniValue *args,
                        RPCMethodImpl *test_impl)

{
  string m_key_name;
  string name;
  RPCResult result;
  string description;
  string description_00;
  RPCResults results;
  RPCExamples examples;
  long in_FS_OFFSET;
  JSONRPCRequest req;
  RPCHelpMan rpc;
  RPCResult null_result;
  _Alloc_hider in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffb00 [24];
  _Alloc_hider in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb20 [24];
  _Vector_impl_data in_stack_fffffffffffffb38;
  pointer in_stack_fffffffffffffb50;
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  undefined8 in_stack_fffffffffffffb70;
  _Alloc_hider in_stack_fffffffffffffb78;
  size_type in_stack_fffffffffffffb80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  vector<UniValue,_std::allocator<UniValue>_> local_450;
  undefined1 local_438 [88];
  undefined1 local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3d8;
  undefined8 local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  VType local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_390;
  vector<UniValue,_std::allocator<UniValue>_> vStack_378;
  undefined4 local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_358;
  undefined8 local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_338;
  undefined8 local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_318;
  undefined8 local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined4 local_2e8;
  long *local_2e0;
  undefined8 local_2d8;
  undefined1 local_2d0;
  undefined7 uStack_2cf;
  undefined8 uStack_2c8;
  long *local_2c0;
  undefined8 local_2b8;
  long local_2b0;
  undefined8 uStack_2a8;
  RPCResult local_2a0;
  long *local_218 [2];
  long local_208 [2];
  _Any_data local_1f8;
  _Manager_type local_1e8 [2];
  RPCHelpMan local_1d8;
  long *local_120 [2];
  long local_110 [2];
  long *local_100 [2];
  long local_f0 [2];
  RPCResult local_e0;
  undefined1 local_48;
  undefined8 local_47;
  undefined4 local_3f;
  undefined2 local_3b;
  undefined1 local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"");
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"None","");
  pRVar1 = (pointer)0x0;
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffffb00._0_8_;
  m_key_name.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffb00._8_16_;
  m_key_name._M_dataplus._M_p = in_stack_fffffffffffffaf8._M_p;
  description._M_string_length = in_stack_fffffffffffffb20._0_8_;
  description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffb20._8_16_;
  description._M_dataplus._M_p = in_stack_fffffffffffffb18._M_p;
  ::RPCResult::RPCResult
            (&local_e0,NONE,m_key_name,description,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffffb38,false);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb58);
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  local_1f8._M_unused._M_object = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"dummy","");
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"dummy description","");
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffb40,params);
  ::RPCResult::RPCResult(&local_2a0,&local_e0);
  result.m_key_name._0_24_ = in_stack_fffffffffffffb00;
  result._0_8_ = in_stack_fffffffffffffaf8._M_p;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffb18._M_p;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<RPCResult,_std::allocator<RPCResult>_>)
       (_Vector_base<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffffb20;
  result._64_24_ = in_stack_fffffffffffffb38;
  result.m_description.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb50;
  result.m_description.field_2._8_8_ = pRVar1;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar2;
  result.m_cond._M_string_length = (size_type)pRVar3;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffffb70;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffffb78._M_p;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffb28,result);
  local_2e0 = (long *)&local_2d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"");
  if (local_2e0 == (long *)&local_2d0) {
    uStack_2a8 = uStack_2c8;
    local_2c0 = &local_2b0;
  }
  else {
    local_2c0 = local_2e0;
  }
  local_2b0 = CONCAT71(uStack_2cf,local_2d0);
  local_2b8 = local_2d8;
  local_2d8 = 0;
  local_2d0 = 0;
  local_2e0 = (long *)&local_2d0;
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             &stack0xfffffffffffffb08,test_impl);
  name._M_string_length = in_stack_fffffffffffffb00._0_8_;
  name.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_fffffffffffffb00._8_16_;
  name._M_dataplus._M_p = &stack0xfffffffffffffb08;
  description_00._M_string_length = in_stack_fffffffffffffb20._0_8_;
  description_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffb20._8_16_;
  description_00._M_dataplus._M_p = in_stack_fffffffffffffb18._M_p;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar1;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb50;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar2;
  examples.m_examples._M_string_length = in_stack_fffffffffffffb70;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar3;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb78._M_p;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffb80;
  RPCHelpMan::RPCHelpMan
            (&local_1d8,name,description_00,
             (vector<RPCArg,_std::allocator<RPCArg>_>)in_stack_fffffffffffffb38,results,examples,
             (RPCMethodImpl *)&local_1f8);
  if ((code *)in_stack_fffffffffffffb18._M_p != (code *)0x0) {
    (*(code *)in_stack_fffffffffffffb18._M_p)(&stack0xfffffffffffffb08,&stack0xfffffffffffffb08,3);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,local_2b0 + 1);
  }
  if (local_2e0 != (long *)&local_2d0) {
    operator_delete(local_2e0,CONCAT71(uStack_2cf,local_2d0) + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.m_cond._M_dataplus._M_p != &local_2a0.m_cond.field_2) {
    operator_delete(local_2a0.m_cond._M_dataplus._M_p,
                    local_2a0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.m_description._M_dataplus._M_p != &local_2a0.m_description.field_2) {
    operator_delete(local_2a0.m_description._M_dataplus._M_p,
                    local_2a0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.m_key_name._M_dataplus._M_p != &local_2a0.m_key_name.field_2) {
    operator_delete(local_2a0.m_key_name._M_dataplus._M_p,
                    local_2a0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffb40);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  if ((_Manager_type *)local_1f8._M_unused._0_8_ != local_1e8) {
    operator_delete(local_1f8._M_unused._M_object,(ulong)(local_1e8[0] + 1));
  }
  local_48 = 0;
  local_438._8_8_ = (long)&(((_Storage<UniValue,_false> *)local_438)->_M_value).val + 0x10;
  local_438._0_4_ = VNULL;
  local_438[0x18] = 0;
  local_438._25_8_ = local_47;
  local_438._33_4_ = local_3f;
  local_438._37_2_ = local_3b;
  local_438[0x27] = local_39;
  local_438._16_8_ = 0;
  local_438._40_8_ = (pointer)0x0;
  local_438._48_8_ = (pointer)0x0;
  local_438._56_8_ = (pointer)0x0;
  local_438._64_8_ = (pointer)0x0;
  local_438._72_8_ = (pointer)0x0;
  local_438._80_8_ = (pointer)0x0;
  local_3e0 = 1;
  local_3d8 = &local_3c8;
  local_3d0 = 0;
  local_3c8._M_local_buf[0] = '\0';
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  local_3b0._M_string_length = 0;
  local_3b0.field_2._M_local_buf[0] = '\0';
  local_358 = &local_348;
  local_360 = 0;
  vStack_378.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  vStack_378.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_390.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_378.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_390.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_390.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_350 = 0;
  local_348._M_local_buf[0] = '\0';
  local_338 = &local_328;
  local_330 = 0;
  local_328._M_local_buf[0] = '\0';
  local_318 = &local_308;
  local_310 = 0;
  local_308._M_local_buf[0] = '\0';
  local_2e8 = 0;
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_3b8 = args->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_3b0,&args->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&local_390,&args->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&vStack_378,&args->values);
  RPCHelpMan::HandleRequest
            ((UniValue *)&stack0xfffffffffffffb70,&local_1d8,
             (JSONRPCRequest *)&((_Storage<UniValue,_false> *)local_438)->_M_value);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_450);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffb78._M_p != &local_478) {
    operator_delete(in_stack_fffffffffffffb78._M_p,local_478._M_allocated_capacity + 1);
  }
  JSONRPCRequest::~JSONRPCRequest
            ((JSONRPCRequest *)&((_Storage<UniValue,_false> *)local_438)->_M_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.m_examples.m_examples._M_dataplus._M_p !=
      &local_1d8.m_examples.m_examples.field_2) {
    operator_delete(local_1d8.m_examples.m_examples._M_dataplus._M_p,
                    local_1d8.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1d8.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1d8.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.m_description._M_dataplus._M_p != &local_1d8.m_description.field_2) {
    operator_delete(local_1d8.m_description._M_dataplus._M_p,
                    local_1d8.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1d8.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_1d8.m_fun,(_Any_data *)&local_1d8.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.m_name._M_dataplus._M_p != &local_1d8.m_name.field_2) {
    operator_delete(local_1d8.m_name._M_dataplus._M_p,
                    local_1d8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.m_cond._M_dataplus._M_p != &local_e0.m_cond.field_2) {
    operator_delete(local_e0.m_cond._M_dataplus._M_p,
                    local_e0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.m_description._M_dataplus._M_p != &local_e0.m_description.field_2) {
    operator_delete(local_e0.m_description._M_dataplus._M_p,
                    local_e0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_e0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.m_key_name._M_dataplus._M_p != &local_e0.m_key_name.field_2) {
    operator_delete(local_e0.m_key_name._M_dataplus._M_p,
                    local_e0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CheckRpc(const std::vector<RPCArg>& params, const UniValue& args, RPCHelpMan::RPCMethodImpl test_impl)
{
    auto null_result{RPCResult{RPCResult::Type::NONE, "", "None"}};
    const RPCHelpMan rpc{"dummy", "dummy description", params, null_result, RPCExamples{""}, test_impl};
    JSONRPCRequest req;
    req.params = args;

    rpc.HandleRequest(req);
}